

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator __thiscall
QHash<std::pair<int,int>,std::function<bool(void*,void*)>>::constFindImpl<std::pair<int,int>>
          (QHash<std::pair<int,int>,std::function<bool(void*,void*)>> *this,pair<int,_int> *key)

{
  Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>> *this_00;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = *(Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>> **)this;
  if ((this_00 !=
       (Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>> *)0x0) &&
     (*(long *)(this_00 + 8) != 0)) {
    BVar3 = QHashPrivate::
            Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>>::
            findBucket<std::pair<int,int>>(this_00,key);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 **)this;
      uVar2 = ((long)BVar3.span - (long)pDVar1->spans) / 0x90 << 7 | BVar3.index;
      goto LAB_00283788;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
            *)0x0;
LAB_00283788:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }